

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue JVar1;
  
  if (((int)new_target.tag != 3) &&
     (new_target.u.ptr != (ctx->rt->current_stack_frame->cur_func).u.ptr)) {
    JVar1 = js_create_from_ctor(ctx,new_target,1);
    return JVar1;
  }
  if (((uint)argv->tag & 0xfffffffe) == 2) {
    JVar1 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
    return JVar1;
  }
  JVar1.tag = argv->tag;
  JVar1.u.ptr = (argv->u).ptr;
  JVar1 = JS_ToObject(ctx,JVar1);
  return JVar1;
}

Assistant:

static JSValue js_object_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue ret;
    if (!JS_IsUndefined(new_target) &&
        JS_VALUE_GET_OBJ(new_target) !=
        JS_VALUE_GET_OBJ(JS_GetActiveFunction(ctx))) {
        ret = js_create_from_ctor(ctx, new_target, JS_CLASS_OBJECT);
    } else {
        int tag = JS_VALUE_GET_NORM_TAG(argv[0]);
        switch(tag) {
        case JS_TAG_NULL:
        case JS_TAG_UNDEFINED:
            ret = JS_NewObject(ctx);
            break;
        default:
            ret = JS_ToObject(ctx, argv[0]);
            break;
        }
    }
    return ret;
}